

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>>
                 (char *target,ArrayPtr<const_char> *first,String *rest,
                 FixedArray<char,_1UL> *rest_1)

{
  char *pcVar1;
  String *first_00;
  FixedArray<char,_1UL> *rest_00;
  char *end;
  char *i;
  FixedArray<char,_1UL> *rest_local_1;
  String *rest_local;
  ArrayPtr<const_char> *first_local;
  char *target_local;
  
  end = ArrayPtr<const_char>::begin(first);
  pcVar1 = ArrayPtr<const_char>::end(first);
  first_local = (ArrayPtr<const_char> *)target;
  while (end != pcVar1) {
    *(char *)&first_local->ptr = *end;
    end = end + 1;
    first_local = (ArrayPtr<const_char> *)((long)&first_local->ptr + 1);
  }
  first_00 = fwd<kj::String>(rest);
  rest_00 = fwd<kj::FixedArray<char,1ul>>(rest_1);
  pcVar1 = fill<kj::String,kj::FixedArray<char,1ul>>((char *)first_local,first_00,rest_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}